

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.cpp
# Opt level: O0

void __thiscall TPZPostProcMat::TPZPostProcMat(TPZPostProcMat *this)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_00000058;
  TPZManVector<TPZPostProcVar,_20> *in_stack_00000060;
  int64_t in_stack_00000088;
  TPZManVector<TPZPostProcVar,_20> *in_stack_00000090;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
  *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZPostProcMat>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02540470);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::TPZMatBase
            (in_stack_ffffffffffffffd0,(void **)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZPostProcMat_02540108;
  *(undefined ***)in_RDI = &PTR__TPZPostProcMat_02540108;
  *(undefined ***)(in_RDI + 0x40) = &PTR__TPZPostProcMat_02540278;
  *(undefined ***)(in_RDI + 0x48) = &PTR__TPZPostProcMat_02540368;
  TPZManVector<TPZPostProcVar,_20>::TPZManVector(in_stack_00000060,in_stack_00000058);
  TPZManVector<TPZPostProcVar,_20>::Resize(in_stack_00000090,in_stack_00000088);
  *(undefined4 *)(in_RDI + 0x4d0) = 0xffffffff;
  return;
}

Assistant:

TPZPostProcMat::TPZPostProcMat() :TPZRegisterClassId(&TPZPostProcMat::ClassId),TBase()
{
	fVars.Resize(0);	
	fDimension = -1;
}